

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

int Gia_MuxMffcSize(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  if ((p->pMuxes != (uint *)0x0) && (iVar1 = 0, p->pMuxes[iObj] != 0)) {
    iVar1 = Gia_MuxDeref(p,iObj);
    iVar2 = Gia_MuxRef(p,iObj);
    if (iVar1 != iVar2) {
      __assert_fail("Count1 == Count2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                    ,0x116,"int Gia_MuxMffcSize(Gia_Man_t *, int)");
    }
  }
  return iVar1;
}

Assistant:

int Gia_MuxMffcSize( Gia_Man_t * p, int iObj )
{
    int Count1, Count2;
    if ( !Gia_ObjIsMuxId(p, iObj) )
        return 0;
    Count1 = Gia_MuxDeref( p, iObj );
    Count2 = Gia_MuxRef( p, iObj );
    assert( Count1 == Count2 );
    return Count1;
}